

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reflect.h
# Opt level: O0

void __thiscall
reflect::TypeDescriptor_StdVector::dump(TypeDescriptor_StdVector *this,void *obj,int indentLevel)

{
  TypeDescriptor *pTVar1;
  int iVar2;
  ostream *poVar3;
  void *pvVar4;
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [32];
  ulong local_60;
  size_t index;
  string local_48 [32];
  size_t local_28;
  size_t numItems;
  void *pvStack_18;
  int indentLevel_local;
  void *obj_local;
  TypeDescriptor_StdVector *this_local;
  
  numItems._4_4_ = indentLevel;
  pvStack_18 = obj;
  obj_local = this;
  local_28 = (*this->getSize)(obj);
  (*(this->super_TypeDescriptor)._vptr_TypeDescriptor[2])();
  std::operator<<((ostream *)&std::cout,local_48);
  std::__cxx11::string::~string(local_48);
  if (local_28 == 0) {
    std::operator<<((ostream *)&std::cout,"{}");
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"{");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    for (local_60 = 0; local_60 < local_28; local_60 = local_60 + 1) {
      iVar2 = numItems._4_4_ * 4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,(long)(iVar2 + 4),' ',&local_81);
      poVar3 = std::operator<<((ostream *)&std::cout,local_80);
      poVar3 = std::operator<<(poVar3,"[");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_60);
      std::operator<<(poVar3,"] ");
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      pTVar1 = this->itemType;
      pvVar4 = (*this->getItem)(pvStack_18,local_60);
      (*pTVar1->_vptr_TypeDescriptor[3])(pTVar1,pvVar4,(ulong)(numItems._4_4_ + 1));
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    }
    iVar2 = numItems._4_4_ << 2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,(long)iVar2,' ',&local_a9);
    poVar3 = std::operator<<((ostream *)&std::cout,local_a8);
    std::operator<<(poVar3,"}");
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  }
  return;
}

Assistant:

virtual void dump(const void* obj, int indentLevel) const override {
        size_t numItems = getSize(obj);
        std::cout << getFullName();
        if (numItems == 0) {
            std::cout << "{}";
        } else {
            std::cout << "{" << std::endl;
            for (size_t index = 0; index < numItems; index++) {
                std::cout << std::string(4 * (indentLevel + 1), ' ') << "[" << index << "] ";
                itemType->dump(getItem(obj, index), indentLevel + 1);
                std::cout << std::endl;
            }
            std::cout << std::string(4 * indentLevel, ' ') << "}";
        }
    }